

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_blocks.cpp
# Opt level: O0

bool libtorrent::request_a_block(torrent *t,peer_connection *c)

{
  piece_block *block;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  pieces;
  pointer this;
  bool bVar1;
  bool bVar2;
  uchar uVar3;
  uchar uVar4;
  picker_options_t options;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_> *pvVar9;
  size_type sVar10;
  size_type sVar11;
  session_settings *psVar12;
  undefined4 extraout_var;
  int *piVar13;
  torrent_info *ptVar14;
  session_interface *psVar15;
  vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_> *this_00;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *suggested_pieces;
  bitfield *this_01;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *this_02;
  reference psVar16;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  alert_manager *paVar17;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 in_stack_fffffffffffffc90;
  undefined4 uVar18;
  bool local_311;
  byte local_2ed;
  int local_190;
  request_flags_t local_181;
  __normal_iterator<const_libtorrent::pending_block_*,_std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>_>
  local_180;
  has_block local_178;
  __normal_iterator<const_libtorrent::pending_block_*,_std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>_>
  local_170;
  __normal_iterator<const_libtorrent::pending_block_*,_std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>_>
  local_168;
  __normal_iterator<const_libtorrent::pending_block_*,_std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>_>
  local_160;
  __normal_iterator<const_libtorrent::pending_block_*,_std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>_>
  local_158;
  has_block local_150;
  __normal_iterator<const_libtorrent::pending_block_*,_std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>_>
  local_148;
  __normal_iterator<const_libtorrent::pending_block_*,_std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>_>
  local_140;
  __normal_iterator<const_libtorrent::pending_block_*,_std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>_>
  local_138;
  piece_block local_130;
  int local_124;
  int local_120;
  int num_block_requests;
  piece_block *local_118;
  piece_block *pb;
  iterator __end1;
  iterator __begin1;
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *__range1;
  piece_block busy_block;
  bool dont_pick_busy_blocks;
  bitfield_flag<unsigned_int,_libtorrent::picker_flags_tag,_void> local_d4;
  int local_d0;
  picker_flags_t flags;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *__range2;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  fast_mask;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *bits;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *suggested;
  vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_> *rq;
  vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_> *dq;
  session_interface *ses;
  int blocks_per_piece;
  int local_6c;
  uint local_68;
  int contiguous_pieces;
  int prefer_contiguous_blocks;
  undefined1 local_58 [8];
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> interesting_pieces;
  piece_picker *p;
  int num_requests;
  int desired_queue_size;
  bool time_critical_mode;
  peer_connection *c_local;
  torrent *t_local;
  
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  bVar1 = torrent::is_seed(t);
  if (bVar1) {
    return false;
  }
  bVar1 = peer_connection::no_download(c);
  if (bVar1) {
    return false;
  }
  bVar1 = torrent::upload_mode(t);
  if (bVar1) {
    return false;
  }
  uVar5 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
  if ((uVar5 & 1) != 0) {
    return false;
  }
  bVar1 = torrent::valid_metadata(t);
  if (!bVar1) {
    return false;
  }
  bVar1 = torrent::are_files_checked(t);
  if (!bVar1) {
    return false;
  }
  bVar1 = torrent::graceful_pause(t);
  if (bVar1) {
    return false;
  }
  iVar6 = torrent::num_time_critical_pieces(t);
  bVar1 = 0 < iVar6;
  if (bVar1) {
    local_190 = 1;
  }
  else {
    local_190 = peer_connection::desired_queue_size(c);
  }
  pvVar9 = peer_connection::download_queue(c);
  sVar10 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::size
                     (pvVar9);
  pvVar9 = peer_connection::request_queue(c);
  sVar11 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::size
                     (pvVar9);
  p._4_4_ = (local_190 - (int)sVar10) - (int)sVar11;
  bVar2 = peer_connection::should_log(c,info);
  if (bVar2) {
    pvVar9 = peer_connection::download_queue(c);
    sVar10 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
             size(pvVar9);
    pvVar9 = peer_connection::request_queue(c);
    sVar11 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
             size(pvVar9);
    bVar2 = peer_connection::endgame(c);
    peer_connection::peer_log
              (c,info,"PIECE_PICKER","dlq: %d rqq: %d target: %d req: %d engame: %d",
               sVar10 & 0xffffffff,sVar11 & 0xffffffff,local_190,CONCAT44(uVar18,p._4_4_),
               (uint)bVar2);
  }
  if (p._4_4_ < 1) {
    return false;
  }
  torrent::need_picker(t);
  interesting_pieces.
  super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)torrent::picker(t);
  std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::vector
            ((vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *)local_58);
  std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::reserve
            ((vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *)local_58,
             100);
  local_68 = peer_connection::prefer_contiguous_blocks(c);
  if ((local_68 == 0) && (!bVar1)) {
    psVar12 = torrent::settings(t);
    iVar6 = aux::session_settings::get_int(psVar12,0x4009);
    if (0 < iVar6) {
      iVar6 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
      iVar6 = stat::download_payload_rate((stat *)CONCAT44(extraout_var,iVar6));
      psVar12 = torrent::settings(t);
      iVar7 = aux::session_settings::get_int(psVar12,0x4009);
      blocks_per_piece = iVar6 * iVar7;
      ses._4_4_ = 0x800000;
      piVar13 = std::min<int>(&blocks_per_piece,(int *)((long)&ses + 4));
      iVar6 = *piVar13;
      ptVar14 = torrent::torrent_file(t);
      local_6c = torrent_info::piece_length(ptVar14);
      local_6c = iVar6 / local_6c;
      ptVar14 = torrent::torrent_file(t);
      iVar6 = torrent_info::piece_length(ptVar14);
      iVar7 = torrent::block_size(t);
      ses._0_4_ = iVar6 / iVar7;
      local_68 = local_6c * (int)ses;
    }
  }
  psVar15 = torrent::session(t);
  pvVar9 = peer_connection::download_queue(c);
  this_00 = peer_connection::request_queue(c);
  suggested_pieces = peer_connection::suggested_pieces(c);
  fast_mask.super_bitfield.m_buf.
  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (bitfield)peer_connection::get_bitfield(c);
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  typed_bitfield((typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                  *)&__range2);
  bVar2 = peer_connection::has_peer_choked(c);
  if (bVar2) {
    this_01 = &peer_connection::get_bitfield(c)->super_bitfield;
    iVar6 = bitfield::size(this_01);
    bitfield::resize((bitfield *)&__range2,iVar6,false);
    this_02 = peer_connection::allowed_fast(c);
    __end2 = std::
             vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ::begin(this_02);
    i = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
        std::
        vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                                       *)&i), bVar2) {
      psVar16 = __gnu_cxx::
                __normal_iterator<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                ::operator*(&__end2);
      flags.m_val = psVar16->m_val;
      bVar2 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
              ::operator[]((typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                            *)fast_mask.super_bitfield.m_buf.
                              super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                              ._M_t.
                              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                              .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,
                           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)flags.m_val)
      ;
      if (bVar2) {
        local_d0 = psVar16->m_val;
        typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
        ::set_bit((typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                   *)&__range2,(strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)local_d0
                 );
      }
      __gnu_cxx::
      __normal_iterator<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
      ::operator++(&__end2);
    }
    fast_mask.super_bitfield.m_buf.
    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (bitfield)&__range2;
  }
  this = interesting_pieces.
         super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar5 = local_68;
  pieces.super_bitfield.m_buf.super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
  ._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       fast_mask.super_bitfield.m_buf.
       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  iVar6 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[9])();
  options = peer_connection::picker_options(c);
  iVar7 = torrent::num_peers(t);
  iVar8 = (*(psVar15->super_session_logger)._vptr_session_logger[0x4b])();
  local_d4.m_val =
       (uint)piece_picker::pick_pieces
                       ((piece_picker *)this,
                        (typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                         *)pieces.super_bitfield.m_buf.
                           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,
                        (vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *
                        )local_58,p._4_4_,uVar5,(torrent_peer *)CONCAT44(extraout_var_00,iVar6),
                        options,suggested_pieces,iVar7,(counters *)CONCAT44(extraout_var_01,iVar8));
  paVar17 = torrent::alerts(t);
  bVar2 = alert_manager::should_post<libtorrent::picker_log_alert>(paVar17);
  if ((bVar2) &&
     (bVar2 = std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::empty
                        ((vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                          *)local_58), !bVar2)) {
    paVar17 = torrent::alerts(t);
    torrent::get_handle((torrent *)&busy_block.block_index);
    iVar6 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[0x12])();
    iVar7 = (*(c->super_bandwidth_socket)._vptr_bandwidth_socket[0xd])();
    alert_manager::
    emplace_alert<libtorrent::picker_log_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::picker_flags_tag,void>const&,std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>&>
              (paVar17,(torrent_handle *)&busy_block.block_index,
               (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_02,iVar6),
               (digest32<160L> *)CONCAT44(extraout_var_03,iVar7),&local_d4,
               (vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *)local_58
              );
    torrent_handle::~torrent_handle((torrent_handle *)&busy_block.block_index);
  }
  uVar5 = local_68;
  sVar10 = std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::size
                     ((vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *)
                      local_58);
  peer_connection::peer_log
            (c,info,"PIECE_PICKER","prefer_contiguous: %d picked: %d",(ulong)uVar5,
             sVar10 & 0xffffffff);
  iVar6 = (*(psVar15->super_session_logger)._vptr_session_logger[0x2d])();
  bVar2 = aux::session_settings::get_bool
                    ((session_settings *)CONCAT44(extraout_var_04,iVar6),0x801e);
  if (bVar2) {
    iVar6 = piece_picker::get_download_queue_size
                      ((piece_picker *)
                       interesting_pieces.
                       super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar7 = piece_picker::num_want_left
                      ((piece_picker *)
                       interesting_pieces.
                       super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar7 <= iVar6) goto LAB_003ed72e;
  }
  else {
LAB_003ed72e:
    sVar10 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
             size(pvVar9);
    sVar11 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
             size(this_00);
    local_2ed = 0;
    if (sVar10 + sVar11 == 0) goto LAB_003ed76d;
  }
  local_2ed = bVar1 ^ 0xff;
LAB_003ed76d:
  busy_block.piece_index.m_val._3_1_ = local_2ed & 1;
  stack0xffffffffffffff0c = piece_block::invalid;
  __end1 = std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::begin
                     ((vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *)
                      local_58);
  pb = (piece_block *)
       std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::end
                 ((vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *)
                  local_58);
  while ((bVar2 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<libtorrent::piece_block_*,_std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>_>
                                      *)&pb), bVar2 &&
         ((local_118 = __gnu_cxx::
                       __normal_iterator<libtorrent::piece_block_*,_std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>_>
                       ::operator*(&__end1), local_68 != 0 || (0 < p._4_4_))))) {
    bVar2 = false;
    if (bVar1) {
      local_120 = (local_118->piece_index).m_val;
      num_block_requests._3_1_ =
           piece_picker::piece_priority
                     ((piece_picker *)
                      interesting_pieces.
                      super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(piece_index_t)local_120);
      uVar3 = aux::strong_typedef::operator_cast_to_unsigned_char
                        ((strong_typedef *)((long)&num_block_requests + 3));
      uVar4 = aux::strong_typedef::operator_cast_to_unsigned_char((strong_typedef *)&top_priority);
      bVar2 = uVar3 != uVar4;
    }
    if (bVar2) break;
    local_130 = *local_118;
    local_124 = piece_picker::num_peers
                          ((piece_picker *)
                           interesting_pieces.
                           super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,local_130);
    if (local_124 < 1) {
      local_140._M_current =
           (pending_block *)
           std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::begin
                     (pvVar9);
      local_148._M_current =
           (pending_block *)
           std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::end
                     (pvVar9);
      aux::has_block::has_block(&local_150,local_118);
      local_138 = std::
                  find_if<__gnu_cxx::__normal_iterator<libtorrent::pending_block_const*,std::vector<libtorrent::pending_block,std::allocator<libtorrent::pending_block>>>,libtorrent::aux::has_block>
                            (local_140,local_148,local_150);
      local_158._M_current =
           (pending_block *)
           std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::end
                     (pvVar9);
      bVar2 = __gnu_cxx::operator!=(&local_138,&local_158);
      local_311 = true;
      if (!bVar2) {
        local_168._M_current =
             (pending_block *)
             std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
             begin(this_00);
        local_170._M_current =
             (pending_block *)
             std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::end
                       (this_00);
        aux::has_block::has_block(&local_178,local_118);
        local_160 = std::
                    find_if<__gnu_cxx::__normal_iterator<libtorrent::pending_block_const*,std::vector<libtorrent::pending_block,std::allocator<libtorrent::pending_block>>>,libtorrent::aux::has_block>
                              (local_168,local_170,local_178);
        local_180._M_current =
             (pending_block *)
             std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::end
                       (this_00);
        local_311 = __gnu_cxx::operator!=(&local_160,&local_180);
      }
      block = local_118;
      if (local_311 == false) {
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::request_flags_tag,_void>::
        bitfield_flag(&local_181);
        bVar2 = peer_connection::add_request(c,block,local_181);
        if (bVar2) {
          p._4_4_ = p._4_4_ + -1;
        }
      }
      else {
        uVar5 = aux::strong_typedef::operator_cast_to_int((strong_typedef *)local_118);
        peer_connection::peer_log
                  (c,info,"PIECE_PICKER","not_picking: %d,%d already in queue",(ulong)uVar5,
                   (ulong)(uint)local_118->block_index);
      }
    }
    else {
      if ((p._4_4_ < 1) || ((busy_block.piece_index.m_val._3_1_ & 1) != 0)) break;
      unique0x00012000 = *local_118;
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::piece_block_*,_std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>_>
    ::operator++(&__end1);
  }
  if (p._4_4_ < 1) {
    peer_connection::set_endgame(c,false);
  }
  else {
    bVar1 = peer_connection::has_peer_choked(c);
    if (!bVar1) {
      peer_connection::set_endgame(c,true);
    }
    bVar1 = piece_block::operator==((piece_block *)((long)&__range1 + 4),&piece_block::invalid);
    if (!bVar1) {
      sVar10 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
               size(pvVar9);
      sVar11 = std::vector<libtorrent::pending_block,_std::allocator<libtorrent::pending_block>_>::
               size(this_00);
      if (sVar10 + sVar11 == 0) {
        peer_connection::add_request(c,(piece_block *)((long)&__range1 + 4),(request_flags_t)0x2);
      }
    }
  }
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  ~typed_bitfield((typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                   *)&__range2);
  std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::~vector
            ((vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *)local_58);
  return true;
}

Assistant:

bool request_a_block(torrent& t, peer_connection& c)
	{
		if (t.is_seed()) return false;
		if (c.no_download()) return false;
		if (t.upload_mode()) return false;
		if (c.is_disconnecting()) return false;

		// don't request pieces before we have the metadata
		if (!t.valid_metadata()) return false;

		// don't request pieces before the peer is properly
		// initialized after we have the metadata
		if (!t.are_files_checked()) return false;

		// we don't want to request more blocks while trying to gracefully pause
		if (t.graceful_pause()) return false;

		TORRENT_ASSERT(c.peer_info_struct() != nullptr
			|| c.type() != connection_type::bittorrent);

		bool const time_critical_mode = t.num_time_critical_pieces() > 0;

		// in time critical mode, only have 1 outstanding request at a time
		// via normal requests
		int const desired_queue_size = time_critical_mode
			? 1 : c.desired_queue_size();

		int num_requests = desired_queue_size
			- int(c.download_queue().size())
			- int(c.request_queue().size());

#ifndef TORRENT_DISABLE_LOGGING
		if (c.should_log(peer_log_alert::info))
		{
			c.peer_log(peer_log_alert::info, "PIECE_PICKER"
				, "dlq: %d rqq: %d target: %d req: %d engame: %d"
				, int(c.download_queue().size()), int(c.request_queue().size())
				, desired_queue_size, num_requests, c.endgame());
		}
#endif
		TORRENT_ASSERT(desired_queue_size > 0);
		// if our request queue is already full, we
		// don't have to make any new requests yet
		if (num_requests <= 0) return false;

		t.need_picker();

		piece_picker& p = t.picker();
		std::vector<piece_block> interesting_pieces;
		interesting_pieces.reserve(100);

		int prefer_contiguous_blocks = c.prefer_contiguous_blocks();

		if (prefer_contiguous_blocks == 0
			&& !time_critical_mode
			&& t.settings().get_int(settings_pack::whole_pieces_threshold) > 0)
		{
			// if our download rate lets us download a whole piece in
			// "whole_pieces_threshold" seconds, we prefer to pick an entire piece.
			// If we can download multiple whole pieces, we prefer to download that
			// many contiguous pieces.

			// download_rate times the whole piece threshold (seconds) gives the
			// number of bytes downloaded in one window of that threshold, divided
			// by the piece size give us the number of (whole) pieces downloaded
			// in the window.
			int const contiguous_pieces =
				std::min(c.statistics().download_payload_rate()
				* t.settings().get_int(settings_pack::whole_pieces_threshold)
				, 8 * 1024 * 1024)
				/ t.torrent_file().piece_length();

			int const blocks_per_piece = t.torrent_file().piece_length() / t.block_size();

			prefer_contiguous_blocks = contiguous_pieces * blocks_per_piece;
		}

		// if we prefer whole pieces, the piece picker will pick at least
		// the number of blocks we want, but it will try to make the picked
		// blocks be from whole pieces, possibly by returning more blocks
		// than we requested.
#if TORRENT_USE_ASSERTS
		error_code ec;
		TORRENT_ASSERT(c.remote() == c.get_socket()->remote_endpoint(ec) || ec);
#endif

		aux::session_interface& ses = t.session();

		std::vector<pending_block> const& dq = c.download_queue();
		std::vector<pending_block> const& rq = c.request_queue();

		std::vector<piece_index_t> const& suggested = c.suggested_pieces();
		auto const* bits = &c.get_bitfield();
		typed_bitfield<piece_index_t> fast_mask;

		if (c.has_peer_choked())
		{
			// if we are choked we can only pick pieces from the
			// allowed fast set. The allowed fast set is sorted
			// in ascending priority order

			// build a bitmask with only the allowed pieces in it
			fast_mask.resize(c.get_bitfield().size(), false);
			for (auto const& i : c.allowed_fast())
			{
				if ((*bits)[i]) fast_mask.set_bit(i);
			}
			bits = &fast_mask;
		}

		// picks the interesting pieces from this peer
		// the integer is the number of pieces that
		// should be guaranteed to be available for download
		// (if num_requests is too big, too many pieces are
		// picked and cpu-time is wasted)
		// the last argument is if we should prefer whole pieces
		// for this peer. If we're downloading one piece in 20 seconds
		// then use this mode.
		picker_flags_t const flags = p.pick_pieces(*bits, interesting_pieces
			, num_requests, prefer_contiguous_blocks, c.peer_info_struct()
			, c.picker_options(), suggested, t.num_peers()
			, ses.stats_counters());

#ifndef TORRENT_DISABLE_LOGGING
		if (t.alerts().should_post<picker_log_alert>()
			&& !interesting_pieces.empty())
		{
			t.alerts().emplace_alert<picker_log_alert>(t.get_handle(), c.remote()
				, c.pid(), flags, interesting_pieces);
		}
		c.peer_log(peer_log_alert::info, "PIECE_PICKER"
			, "prefer_contiguous: %d picked: %d"
			, prefer_contiguous_blocks, int(interesting_pieces.size()));
#else
		TORRENT_UNUSED(flags);
#endif

		// if the number of pieces we have + the number of pieces
		// we're requesting from is less than the number of pieces
		// in the torrent, there are still some unrequested pieces
		// and we're not strictly speaking in end-game mode yet
		// also, if we already have at least one outstanding
		// request, we shouldn't pick any busy pieces either
		// in time critical mode, it's OK to request busy blocks
		bool const dont_pick_busy_blocks
			= ((ses.settings().get_bool(settings_pack::strict_end_game_mode)
				&& p.get_download_queue_size() < p.num_want_left())
				|| dq.size() + rq.size() > 0)
				&& !time_critical_mode;

		// this is filled with an interesting piece
		// that some other peer is currently downloading
		piece_block busy_block = piece_block::invalid;

		for (piece_block const& pb : interesting_pieces)
		{
			if (prefer_contiguous_blocks == 0 && num_requests <= 0) break;

			if (time_critical_mode && p.piece_priority(pb.piece_index) != top_priority)
			{
				// assume the subsequent pieces are not prio 7 and
				// be done
				break;
			}

			int num_block_requests = p.num_peers(pb);
			if (num_block_requests > 0)
			{
				// have we picked enough pieces?
				if (num_requests <= 0) break;

				// this block is busy. This means all the following blocks
				// in the interesting_pieces list are busy as well, we might
				// as well just exit the loop
				if (dont_pick_busy_blocks) break;

				TORRENT_ASSERT(p.num_peers(pb) > 0);
				busy_block = pb;
				continue;
			}

			TORRENT_ASSERT(p.num_peers(pb) == 0);

			// don't request pieces we already have in our request queue
			// This happens when pieces time out or the peer sends us
			// pieces we didn't request. Those aren't marked in the
			// piece picker, but we still keep track of them in the
			// download queue
			if (std::find_if(dq.begin(), dq.end(), aux::has_block(pb)) != dq.end()
				|| std::find_if(rq.begin(), rq.end(), aux::has_block(pb)) != rq.end())
			{
#if TORRENT_USE_ASSERTS
				std::vector<pending_block>::const_iterator j
					= std::find_if(dq.begin(), dq.end(), aux::has_block(pb));
				if (j != dq.end()) TORRENT_ASSERT(j->timed_out || j->not_wanted);
#endif
#ifndef TORRENT_DISABLE_LOGGING
				c.peer_log(peer_log_alert::info, "PIECE_PICKER"
					, "not_picking: %d,%d already in queue"
					, static_cast<int>(pb.piece_index), pb.block_index);
#endif
				continue;
			}

			// ok, we found a piece that's not being downloaded
			// by somebody else. request it from this peer
			// and return
			if (!c.add_request(pb, {})) continue;
			TORRENT_ASSERT(p.num_peers(pb) == 1);
			TORRENT_ASSERT(p.is_requested(pb));
			num_requests--;
		}

		// we have picked as many blocks as we should
		// we're done!
		if (num_requests <= 0)
		{
			// since we could pick as many blocks as we
			// requested without having to resort to picking
			// busy ones, we're not in end-game mode
			c.set_endgame(false);
			return true;
		}

		// we did not pick as many pieces as we wanted, because
		// there aren't enough. This means we're in end-game mode
		// as long as we have at least one request outstanding,
		// we shouldn't pick another piece
		// if we are attempting to download 'allowed' pieces
		// and can't find any, that doesn't count as end-game
		if (!c.has_peer_choked())
			c.set_endgame(true);

		// if we don't have any potential busy blocks to request
		// or if we already have outstanding requests, don't
		// pick a busy piece
		if (busy_block == piece_block::invalid
			|| dq.size() + rq.size() > 0)
		{
			return true;
		}

#if TORRENT_USE_ASSERTS
		piece_picker::downloading_piece st;
		p.piece_info(busy_block.piece_index, st);
		TORRENT_ASSERT(st.requested + st.finished + st.writing
			== p.blocks_in_piece(busy_block.piece_index));
#endif
		TORRENT_ASSERT(p.is_requested(busy_block));
		TORRENT_ASSERT(!p.is_downloaded(busy_block));
		TORRENT_ASSERT(!p.is_finished(busy_block));
		TORRENT_ASSERT(p.num_peers(busy_block) > 0);

		c.add_request(busy_block, peer_connection::busy);
		return true;
	}